

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

void __thiscall
QHttp2ProtocolHandler::finishStreamWithError
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,NetworkError error,QString *message)

{
  QDebug QVar1;
  QLoggingCategory *pQVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QDebug local_70;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> local_68;
  QHttp2Stream *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = stream;
  QHttp2Stream::sendRST_STREAM((QHttp2Stream *)stream,CANCEL);
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::value
            (&local_68,
             (QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             (this + 0x50),&local_50);
  if (local_68.second != (QHttpNetworkReply *)0x0) {
    QObject::disconnect(&(local_68.second)->super_QObject,(char *)0x0,(QObject *)this,(char *)0x0);
    QHttpNetworkReply::finishedWithError((QHttpNetworkReply *)local_68.second,error,message);
  }
  pQVar2 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::warning();
    QVar1.stream = local_70.stream;
    QVar4.m_data = &DAT_00000006;
    QVar4.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_70.stream,local_50->m_streamID);
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    QVar1.stream = local_70.stream;
    QVar5.m_data = (storage_type *)0x14;
    QVar5.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    pcVar3 = (message->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_70,(ulong)pcVar3);
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    QDebug::~QDebug(&local_70);
  }
  QHttpNetworkRequest::~QHttpNetworkRequest(&local_68.first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::finishStreamWithError(QHttp2Stream *stream,
        QNetworkReply::NetworkError error, const QString &message)
{
    stream->sendRST_STREAM(CANCEL);
    const HttpMessagePair &pair = requestReplyPairs.value(stream);
    if (auto *httpReply = pair.second) {
        httpReply->disconnect(this);

        // TODO: error message must be translated!!! (tr)
        emit httpReply->finishedWithError(error, message);
    }

    qCWarning(QT_HTTP2) << "stream" << stream->streamID() << "finished with error:" << message;
}